

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

int main_internal(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  char *pCommand_line;
  undefined4 in_register_0000003c;
  uint uVar3;
  dynamic_string cmd_line;
  corpus_gen generator;
  dynamic_string local_c0;
  undefined1 local_b0 [144];
  
  crnlib::colorized_console::init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  bVar1 = check_for_option(argc,argv,"quiet");
  if (bVar1) {
    crnlib::console::m_output_disabled = 1;
  }
  crnlib::console::printf
            (
            "crunch - Advanced DXTn Texture Compressor - https://github.com/FrozenStormInteractive/Crunch2"
            );
  pCommand_line = "";
  crnlib::console::printf("");
  crnlib::console::printf("Copyright (c) 2010-2016 Richard Geldreich, Jr. and Binomial LLC");
  crnlib::console::printf("Copyright (c) 2020-2021 FrozenStorm Interactive, Yoann Potinet");
  crnlib::console::printf("");
  pcVar2 = crn_get_version();
  crnlib::console::printf("crnlib version %s %s Built %s, %s",pcVar2,"x64","Apr 27 2025","00:31:18")
  ;
  crnlib::console::printf("");
  bVar1 = check_for_option(argc,argv,"version");
  uVar3 = 0;
  if (!bVar1) {
    bVar1 = check_for_option(argc,argv,"help");
    if (bVar1) {
      crunch::print_usage();
      uVar3 = 0;
    }
    else {
      local_c0.m_buf_size = 0;
      local_c0.m_len = 0;
      local_c0.m_pStr = (char *)0x0;
      crnlib::get_command_line_as_single_string(&local_c0,argc,argv);
      bVar1 = check_for_option(argc,argv,"corpus_gen");
      if (bVar1) {
        crn::corpus_gen::corpus_gen((corpus_gen *)local_b0);
        if (local_c0.m_pStr != (char *)0x0) {
          pCommand_line = local_c0.m_pStr;
        }
        bVar1 = crn::corpus_gen::generate((corpus_gen *)local_b0,pCommand_line);
      }
      else {
        bVar1 = check_for_option(argc,argv,"corpus_test");
        if (bVar1) {
          crn::corpus_tester::corpus_tester((corpus_tester *)local_b0);
          if (local_c0.m_pStr != (char *)0x0) {
            pCommand_line = local_c0.m_pStr;
          }
          bVar1 = crn::corpus_tester::test((corpus_tester *)local_b0,pCommand_line);
          crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
                    ((vector<crnlib::color_quad<unsigned_char,_int>_> *)(local_b0 + 0x20));
        }
        else {
          crunch::crunch((crunch *)local_b0);
          if (local_c0.m_pStr != (char *)0x0) {
            pCommand_line = local_c0.m_pStr;
          }
          bVar1 = crunch::convert((crunch *)local_b0,pCommand_line);
          crunch::~crunch((crunch *)local_b0);
        }
      }
      crnlib::colorized_console::deinit();
      crnlib::crnlib_print_mem_stats();
      uVar3 = (uint)(bVar1 ^ 1);
      crnlib::dynamic_string::~dynamic_string(&local_c0);
    }
  }
  return uVar3;
}

Assistant:

static int main_internal(int argc, char* argv[])
{
    argc;
    argv;

    colorized_console::init();

    if (check_for_option(argc, argv, "quiet"))
    {
        console::disable_output();
    }

    print_title();

    if (check_for_option(argc, argv, "version"))
    {
        return EXIT_SUCCESS;
    }

    if (check_for_option(argc, argv, "help"))
    {
        crunch::print_usage();
        return EXIT_SUCCESS;
    }

    dynamic_string cmd_line;
    get_command_line_as_single_string(cmd_line, argc, argv);

    bool status = false;
    if (check_for_option(argc, argv, "corpus_gen"))
    {
        corpus_gen generator;
        status = generator.generate(cmd_line.get_ptr());
    }
    else if (check_for_option(argc, argv, "corpus_test"))
    {
        corpus_tester tester;
        status = tester.test(cmd_line.get_ptr());
    }
    else
    {
        crunch converter;
        status = converter.convert(cmd_line.get_ptr());
    }

    colorized_console::deinit();

    crnlib_print_mem_stats();

    return status ? EXIT_SUCCESS : EXIT_FAILURE;
}